

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O0

void Update_Chan_Algo3_LFO(ym2612_ *YM2612,channel_ *CH,DEV_SMPL **buf,UINT32 length)

{
  int iVar1;
  int iVar2;
  int freq_LFO;
  int env_LFO;
  UINT32 i;
  UINT32 length_local;
  DEV_SMPL **buf_local;
  channel_ *CH_local;
  ym2612_ *YM2612_local;
  
  if (CH->SLOT[3].Ecnt != 0x20000000) {
    for (freq_LFO = 0; (uint)freq_LFO < length; freq_LFO = freq_LFO + 1) {
      YM2612->in0 = CH->SLOT[0].Fcnt;
      YM2612->in1 = CH->SLOT[2].Fcnt;
      YM2612->in2 = CH->SLOT[1].Fcnt;
      YM2612->in3 = CH->SLOT[3].Fcnt;
      iVar1 = CH->FMS * YM2612->LFO_FREQ_UP[(uint)freq_LFO] >> 9;
      if (iVar1 == 0) {
        CH->SLOT[0].Fcnt = CH->SLOT[0].Finc + CH->SLOT[0].Fcnt;
        CH->SLOT[2].Fcnt = CH->SLOT[2].Finc + CH->SLOT[2].Fcnt;
        CH->SLOT[1].Fcnt = CH->SLOT[1].Finc + CH->SLOT[1].Fcnt;
        CH->SLOT[3].Fcnt = CH->SLOT[3].Finc + CH->SLOT[3].Fcnt;
      }
      else {
        CH->SLOT[0].Fcnt = CH->SLOT[0].Finc + (CH->SLOT[0].Finc * iVar1 >> 9) + CH->SLOT[0].Fcnt;
        CH->SLOT[2].Fcnt = CH->SLOT[2].Finc + (CH->SLOT[2].Finc * iVar1 >> 9) + CH->SLOT[2].Fcnt;
        CH->SLOT[1].Fcnt = CH->SLOT[1].Finc + (CH->SLOT[1].Finc * iVar1 >> 9) + CH->SLOT[1].Fcnt;
        CH->SLOT[3].Fcnt = CH->SLOT[3].Finc + (CH->SLOT[3].Finc * iVar1 >> 9) + CH->SLOT[3].Fcnt;
      }
      iVar1 = YM2612->LFO_ENV_UP[(uint)freq_LFO];
      if ((CH->SLOT[0].SEG & 4U) == 0) {
        YM2612->en0 = ENV_TAB[CH->SLOT[0].Ecnt >> 0x10] + CH->SLOT[0].TLL +
                      (iVar1 >> ((byte)CH->SLOT[0].AMS & 0x1f));
      }
      else {
        iVar2 = ENV_TAB[CH->SLOT[0].Ecnt >> 0x10] + CH->SLOT[0].TLL;
        YM2612->en0 = iVar2;
        if (iVar2 < 0x1000) {
          YM2612->en0 = (YM2612->en0 ^ 0xfffU) + (iVar1 >> ((byte)CH->SLOT[0].AMS & 0x1f));
        }
        else {
          YM2612->en0 = 0;
        }
      }
      if ((CH->SLOT[2].SEG & 4U) == 0) {
        YM2612->en1 = ENV_TAB[CH->SLOT[2].Ecnt >> 0x10] + CH->SLOT[2].TLL +
                      (iVar1 >> ((byte)CH->SLOT[2].AMS & 0x1f));
      }
      else {
        iVar2 = ENV_TAB[CH->SLOT[2].Ecnt >> 0x10] + CH->SLOT[2].TLL;
        YM2612->en1 = iVar2;
        if (iVar2 < 0x1000) {
          YM2612->en1 = (YM2612->en1 ^ 0xfffU) + (iVar1 >> ((byte)CH->SLOT[2].AMS & 0x1f));
        }
        else {
          YM2612->en1 = 0;
        }
      }
      if ((CH->SLOT[1].SEG & 4U) == 0) {
        YM2612->en2 = ENV_TAB[CH->SLOT[1].Ecnt >> 0x10] + CH->SLOT[1].TLL +
                      (iVar1 >> ((byte)CH->SLOT[1].AMS & 0x1f));
      }
      else {
        iVar2 = ENV_TAB[CH->SLOT[1].Ecnt >> 0x10] + CH->SLOT[1].TLL;
        YM2612->en2 = iVar2;
        if (iVar2 < 0x1000) {
          YM2612->en2 = (YM2612->en2 ^ 0xfffU) + (iVar1 >> ((byte)CH->SLOT[1].AMS & 0x1f));
        }
        else {
          YM2612->en2 = 0;
        }
      }
      if ((CH->SLOT[3].SEG & 4U) == 0) {
        YM2612->en3 = ENV_TAB[CH->SLOT[3].Ecnt >> 0x10] + CH->SLOT[3].TLL +
                      (iVar1 >> ((byte)CH->SLOT[3].AMS & 0x1f));
      }
      else {
        iVar2 = ENV_TAB[CH->SLOT[3].Ecnt >> 0x10] + CH->SLOT[3].TLL;
        YM2612->en3 = iVar2;
        if (iVar2 < 0x1000) {
          YM2612->en3 = (YM2612->en3 ^ 0xfffU) + (iVar1 >> ((byte)CH->SLOT[3].AMS & 0x1f));
        }
        else {
          YM2612->en3 = 0;
        }
      }
      iVar1 = CH->SLOT[0].Einc + CH->SLOT[0].Ecnt;
      CH->SLOT[0].Ecnt = iVar1;
      if (CH->SLOT[0].Ecmp <= iVar1) {
        (*ENV_NEXT_EVENT[CH->SLOT[0].Ecurp])(YM2612,CH->SLOT);
      }
      iVar1 = CH->SLOT[2].Einc + CH->SLOT[2].Ecnt;
      CH->SLOT[2].Ecnt = iVar1;
      if (CH->SLOT[2].Ecmp <= iVar1) {
        (*ENV_NEXT_EVENT[CH->SLOT[2].Ecurp])(YM2612,CH->SLOT + 2);
      }
      iVar1 = CH->SLOT[1].Einc + CH->SLOT[1].Ecnt;
      CH->SLOT[1].Ecnt = iVar1;
      if (CH->SLOT[1].Ecmp <= iVar1) {
        (*ENV_NEXT_EVENT[CH->SLOT[1].Ecurp])(YM2612,CH->SLOT + 1);
      }
      iVar1 = CH->SLOT[3].Einc + CH->SLOT[3].Ecnt;
      CH->SLOT[3].Ecnt = iVar1;
      if (CH->SLOT[3].Ecmp <= iVar1) {
        (*ENV_NEXT_EVENT[CH->SLOT[3].Ecurp])(YM2612,CH->SLOT + 3);
      }
      YM2612->in0 = (CH->S0_OUT[0] + CH->S0_OUT[1] >> ((byte)CH->FB & 0x1f)) + YM2612->in0;
      CH->S0_OUT[1] = CH->S0_OUT[0];
      CH->S0_OUT[0] = SIN_TAB[(int)(YM2612->in0 >> 0xe & 0xfff)][YM2612->en0];
      YM2612->in1 = CH->S0_OUT[1] + YM2612->in1;
      YM2612->in3 = SIN_TAB[(int)(YM2612->in1 >> 0xe & 0xfff)][YM2612->en1] +
                    SIN_TAB[(int)(YM2612->in2 >> 0xe & 0xfff)][YM2612->en2] + YM2612->in3;
      CH->OUTd = SIN_TAB[(int)(YM2612->in3 >> 0xe & 0xfff)][YM2612->en3] >> 0xf;
      (*buf)[(uint)freq_LFO] = (CH->OUTd & CH->LEFT) + (*buf)[(uint)freq_LFO];
      buf[1][(uint)freq_LFO] = (CH->OUTd & CH->RIGHT) + buf[1][(uint)freq_LFO];
    }
  }
  return;
}

Assistant:

static void Update_Chan_Algo3_LFO(ym2612_ *YM2612, channel_ *CH, DEV_SMPL **buf, UINT32 length)
{
  UINT32 i;
  int env_LFO, freq_LFO;

  if (CH->SLOT[S3].Ecnt == ENV_END)
    return;

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "\n\nAlgo 3 LFO len = %d\n\n", length);
#endif

  for (i = 0; i < length; i++)
  {
    GET_CURRENT_PHASE
    UPDATE_PHASE_LFO
    GET_CURRENT_ENV_LFO
    UPDATE_ENV
    DO_ALGO_3
    DO_OUTPUT
  }
}